

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::numtostr::x_write<unsigned_long>(numtostr *this,ulong x)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  
  if (x == 0) {
    (this->m_buf)._M_elems[0] = '0';
  }
  else {
    pcVar2 = this[-1].m_buf._M_elems + 0x3f;
    lVar4 = 0x3f;
    do {
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar5) {
        __assert_fail("x == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x2066,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = unsigned long]"
                     );
      }
      pcVar2[1] = (char)x + (char)(x / 10) * -10 | 0x30;
      pcVar2 = pcVar2 + 1;
      bVar5 = 9 < x;
      x = x / 10;
    } while (bVar5);
    if (this < pcVar2) {
      pcVar3 = (this->m_buf)._M_elems;
      do {
        pcVar3 = pcVar3 + 1;
        cVar1 = pcVar3[-1];
        pcVar3[-1] = *pcVar2;
        *pcVar2 = cVar1;
        pcVar2 = pcVar2 + -1;
      } while (pcVar3 < pcVar2);
    }
  }
  return;
}

Assistant:

void x_write(NumberType x, /*is_integral=*/std::true_type)
        {
            // special case for "0"
            if (x == 0)
            {
                m_buf[0] = '0';
                return;
            }

            const bool is_negative = x < 0;
            size_t i = 0;

            // spare 1 byte for '\0'
            while (x != 0 and i < m_buf.size() - 1)
            {
                const auto digit = std::labs(static_cast<long>(x % 10));
                m_buf[i++] = static_cast<char>('0' + digit);
                x /= 10;
            }

            // make sure the number has been processed completely
            assert(x == 0);

            if (is_negative)
            {
                // make sure there is capacity for the '-'
                assert(i < m_buf.size() - 2);
                m_buf[i++] = '-';
            }

            std::reverse(m_buf.begin(), m_buf.begin() + i);
        }